

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawInventoryBar::Draw
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  FImageCollection *this_00;
  Styles SVar1;
  CommandDrawNumber *pCVar2;
  int iVar3;
  int iVar4;
  SBarInfoCoordinate x;
  AInventory *pAVar5;
  ulong uVar6;
  FTexture *pFVar7;
  AInventory *pAVar8;
  int iVar9;
  SBarInfoCoordinate y;
  SBarInfoCoordinate y_00;
  SBarInfoCoordinate SVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  double Alpha;
  double Alpha_00;
  AInventory *local_40;
  
  iVar3 = GetCounterSpacing(this,statusBar);
  Alpha = block->currentAlpha;
  if (this->translucent != false) {
    Alpha = Alpha * 0.59375;
  }
  pAVar5 = DBaseStatusBar::ValidateInvFirst(&statusBar->super_DBaseStatusBar,this->size);
  (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar5;
  pAVar5 = GC::ReadBarrier<AInventory>
                     ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
  if ((pAVar5 != (AInventory *)0x0) || (this->alwaysShow == true)) {
    local_40 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst)
    ;
    this_00 = &statusBar->Images;
    iVar13 = 0;
    uVar12 = 0;
    while( true ) {
      uVar6 = (ulong)this->size;
      if ((local_40 == (AInventory *)0x0) || (uVar6 <= uVar12)) break;
      bVar16 = this->vertical != false;
      iVar4 = iVar13;
      if (bVar16) {
        iVar4 = 0;
      }
      iVar9 = 0;
      if (bVar16) {
        iVar9 = iVar13;
      }
      x = (SBarInfoCoordinate)(iVar4 + (int)this->x);
      y = (SBarInfoCoordinate)(iVar9 + (int)this->y);
      if (this->noArtibox == false) {
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,x,y,block->xOffset,block->yOffset,Alpha,block->fullScreenOffsets
                   ,false,false,0);
      }
      if (this->style != STYLE_Strife) {
        pFVar7 = FTextureManager::operator()(&TexMan,(FTextureID)(local_40->Icon).texnum,false);
        bVar16 = this->style != STYLE_HexenStrict;
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,(SBarInfoCoordinate)((int)x + -4 + (uint)bVar16 * 4),
                   (SBarInfoCoordinate)((int)y + -2 + (uint)bVar16 * 2),block->xOffset,
                   block->yOffset,block->currentAlpha,block->fullScreenOffsets,false,
                   local_40->Amount < 1,0);
      }
      pAVar5 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      if (local_40 != pAVar5) goto LAB_005743fc;
      uVar11 = statusBar->invBarOffset;
      SVar10 = x;
      switch(this->style) {
      case STYLE_Heretic:
        pFVar7 = FImageCollection::operator[](this_00,uVar11 + 1);
        y_00 = (SBarInfoCoordinate)((int)y + 0x3a);
        break;
      case STYLE_Hexen:
        pFVar7 = FImageCollection::operator[](this_00,uVar11 + 1);
        y_00 = (SBarInfoCoordinate)((int)y + -2);
        break;
      case STYLE_HexenStrict:
        pFVar7 = FImageCollection::operator[](this_00,uVar11 + 1);
        SVar10 = (SBarInfoCoordinate)((int)x + -2);
        y_00 = (SBarInfoCoordinate)((int)y + -2);
        goto LAB_0057434b;
      case STYLE_Strife:
        pFVar7 = FImageCollection::operator[](this_00,uVar11 + 2);
        SVar10 = (SBarInfoCoordinate)((int)x + -0xc);
        y_00 = (SBarInfoCoordinate)((int)y + -4);
LAB_0057434b:
        iVar4 = block->xOffset;
        iVar9 = block->yOffset;
        Alpha_00 = block->currentAlpha;
        bVar16 = block->fullScreenOffsets;
        goto LAB_005743db;
      default:
        pFVar7 = FImageCollection::operator[](this_00,uVar11 + 1);
        iVar4 = block->xOffset;
        iVar9 = block->yOffset;
        Alpha_00 = block->currentAlpha;
        bVar16 = block->fullScreenOffsets;
        y_00 = y;
        goto LAB_005743db;
      }
      iVar4 = block->xOffset;
      iVar9 = block->yOffset;
      Alpha_00 = block->currentAlpha;
      bVar16 = block->fullScreenOffsets;
LAB_005743db:
      DSBarInfo::DrawGraphic(statusBar,pFVar7,SVar10,y_00,iVar4,iVar9,Alpha_00,bVar16,false,false,0)
      ;
LAB_005743fc:
      if (this->style == STYLE_Strife) {
        pFVar7 = FTextureManager::operator()(&TexMan,(FTextureID)(local_40->Icon).texnum,false);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,x,y,block->xOffset,block->yOffset,block->currentAlpha,
                   block->fullScreenOffsets,false,local_40->Amount < 1,0);
      }
      if ((this->counters != (CommandDrawNumber **)0x0) &&
         ((this->alwaysShowCounter != false || (local_40->Amount != 1)))) {
        pCVar2 = this->counters[uVar12];
        (pCVar2->super_CommandDrawString).valueArgument = local_40->Amount;
        (*(pCVar2->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand[2])
                  (pCVar2,block,statusBar);
      }
      local_40 = AInventory::NextInv(local_40);
      uVar12 = uVar12 + 1;
      iVar13 = iVar13 + iVar3 * 2;
    }
    while (((uint)uVar12 < (uint)uVar6 && (this->noArtibox == false))) {
      pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset);
      bVar16 = this->vertical != false;
      iVar4 = iVar13;
      if (bVar16) {
        iVar4 = 0;
      }
      iVar9 = 0;
      if (bVar16) {
        iVar9 = iVar13;
      }
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,(SBarInfoCoordinate)(iVar4 + (int)this->x),
                 (SBarInfoCoordinate)(iVar9 + (int)this->y),block->xOffset,block->yOffset,Alpha,
                 block->fullScreenOffsets,false,false,0);
      uVar12 = (ulong)((uint)uVar12 + 1);
      uVar6 = (ulong)this->size;
      iVar13 = iVar13 + iVar3 * 2;
    }
    if (this->noArrows == false) {
      pAVar5 = AActor::FirstInv(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
      pAVar8 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst)
      ;
      if (pAVar5 != pAVar8) {
        SVar1 = this->style;
        uVar11 = 0xe;
        if (SVar1 != STYLE_Strife) {
          uVar11 = (uint)(SVar1 == STYLE_HexenStrict) * 2 | 0xfffffff4;
        }
        uVar14 = -(uint)(SVar1 == STYLE_HexenStrict);
        pFVar7 = FImageCollection::operator[]
                           (this_00,(statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 4);
        uVar15 = uVar14;
        if (this->vertical != false) {
          uVar15 = uVar11;
          uVar11 = uVar14;
        }
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,(SBarInfoCoordinate)(uVar11 * 2 + (int)this->x),
                   (SBarInfoCoordinate)(uVar15 * 2 + (int)this->y),block->xOffset,block->yOffset,
                   block->currentAlpha,block->fullScreenOffsets,false,false,0);
      }
    }
    if ((local_40 != (AInventory *)0x0) && (this->noArrows == false)) {
      SVar1 = this->style;
      uVar11 = this->size;
      if (SVar1 == STYLE_HexenStrict) {
        iVar3 = uVar11 * 0x1f;
      }
      else if (SVar1 == STYLE_Strife) {
        iVar3 = uVar11 * 0x23 + -4;
      }
      else {
        iVar3 = uVar11 * 0x1f + 2;
      }
      pFVar7 = FImageCollection::operator[]
                         (this_00,(statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 6);
      iVar13 = -(uint)(SVar1 == STYLE_HexenStrict);
      if (this->vertical != false) {
        iVar13 = iVar3;
        iVar3 = -(uint)(SVar1 == STYLE_HexenStrict);
      }
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,(SBarInfoCoordinate)(iVar3 * 2 + (int)this->x),
                 (SBarInfoCoordinate)(iVar13 * 2 + (int)this->y),block->xOffset,block->yOffset,
                 block->currentAlpha,block->fullScreenOffsets,false,false,0);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			int spacing = GetCounterSpacing(statusBar);
		
			double bgalpha = block->Alpha();
			if(translucent)
				bgalpha *= HX_SHADOW;
		
			AInventory *item;
			unsigned int i = 0;
			// If the player has no artifacts, don't draw the bar
			statusBar->CPlayer->mo->InvFirst = statusBar->ValidateInvFirst(size);
			if(statusBar->CPlayer->mo->InvFirst != NULL || alwaysShow)
			{
				for(item = statusBar->CPlayer->mo->InvFirst, i = 0; item != NULL && i < size; item = item->NextInv(), ++i)
				{
					SBarInfoCoordinate rx = x + (!vertical ? i*spacing : 0);
					SBarInfoCoordinate ry = y + (vertical ? i*spacing : 0);
					if(!noArtibox)
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], rx, ry, block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
					if(style != STYLE_Strife) //Strife draws the cursor before the icons
						statusBar->DrawGraphic(TexMan(item->Icon), rx - (style == STYLE_HexenStrict ? 2 : 0), ry - (style == STYLE_HexenStrict ? 1 : 0), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(item == statusBar->CPlayer->mo->InvSel)
					{
						if(style == STYLE_Heretic)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry+29, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Hexen)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_HexenStrict)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx-1, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Strife)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], rx-6, ry-2, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
					}
					if(style == STYLE_Strife)
						statusBar->DrawGraphic(TexMan(item->Icon), rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(counters != NULL && (alwaysShowCounter || item->Amount != 1))
					{
						counters[i]->valueArgument = item->Amount;
						counters[i]->Draw(block, statusBar);
					}
				}
				for (; i < size && !noArtibox; ++i)
					statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], x + (!vertical ? (i*spacing) : 0), y + (vertical ? (i*spacing) : 0), block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
				// Is there something to the left?
				if (!noArrows && statusBar->CPlayer->mo->FirstInv() != statusBar->CPlayer->mo->InvFirst)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? -12 : -10) : 14);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVLFGEM1 : statusBar->invBarOffset + imgINVLFGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
				// Is there something to the right?
				if (!noArrows && item != NULL)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? size*31+2 : size*31) : size*35-4);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVRTGEM1 : statusBar->invBarOffset + imgINVRTGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
			}
		}